

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::ConsoleAssertionPrinter::printOriginalExpression
          (ConsoleAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_50;
  ColourGuard local_20;
  ConsoleAssertionPrinter *local_10;
  ConsoleAssertionPrinter *this_local;
  
  local_10 = this;
  bVar1 = AssertionResult::hasExpression(this->result);
  if (bVar1) {
    poVar2 = this->stream;
    ColourImpl::guardColour((ColourImpl *)&local_20,(Code)this->colourImpl);
    poVar2 = Catch::operator<<(poVar2,&local_20);
    poVar2 = std::operator<<(poVar2,"  ");
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_50,this->result);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_50);
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            stream << colourImpl->guardColour( Colour::OriginalExpression )
                   << "  " << result.getExpressionInMacro() << '\n';
        }
    }